

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateFunctionElimination.cpp
# Opt level: O2

void __thiscall
wasm::DuplicateFunctionElimination::run(DuplicateFunctionElimination *this,Module *module)

{
  size_t *pred;
  Function *left;
  Function *right;
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  _Base_ptr p_Var4;
  size_type sVar5;
  mapped_type *pmVar6;
  PassRunner *pPVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  anon_class_16_2_f86d9413 visitor;
  undefined1 local_248 [8];
  map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  hashGroups;
  undefined1 local_118 [8];
  Map hashes;
  undefined1 local_c8 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  replacements;
  undefined1 local_60 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> duplicates;
  
  pPVar7 = (this->super_Pass).runner;
  iVar10 = (pPVar7->options).optimizeLevel;
  if ((iVar10 < 3) && ((pPVar7->options).shrinkLevel < 1)) {
    pPVar7 = (PassRunner *)(ulong)(iVar10 == 2);
    uVar11 = (ulong)((uint)(iVar10 == 2) * 9 + 1);
  }
  else {
    uVar11 = (ulong)((long)(module->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(module->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
  }
  while( true ) {
    iVar10 = (int)uVar11;
    uVar11 = (ulong)(iVar10 - 1);
    if (iVar10 == 0) {
      return;
    }
    FunctionHasher::createMap((Map *)local_118,module);
    hashGroups._M_t._M_impl._0_8_ = 0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         &hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
         0xffffffffffffff00);
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_248 = (undefined1  [8])&PTR__FunctionHasher_00e1e3c0;
    WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
           *)local_248,(this->super_Pass).runner,module);
    FunctionHasher::~FunctionHasher((FunctionHasher *)local_248);
    hashGroups._M_t._M_impl._0_8_ = hashGroups._M_t._M_impl._0_8_ & 0xffffffff00000000;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&hashGroups;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    visitor.hashes = (Map *)pPVar7;
    visitor.hashGroups =
         (map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
          *)local_118;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    wasm::ModuleUtils::
    iterDefinedFunctions<wasm::DuplicateFunctionElimination::run(wasm::Module*)::_lambda(wasm::Function*)_1_>
              ((ModuleUtils *)module,(Module *)local_248,visitor);
    replacements._M_t._M_impl._0_4_ = 0;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&replacements;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    duplicates._M_t._M_impl._0_4_ = 0;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&duplicates;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (p_Var4 = hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 != (_Rb_tree_node_base *)&hashGroups;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      uVar3 = (long)p_Var4[1]._M_left - (long)p_Var4[1]._M_parent;
      pPVar7 = (PassRunner *)0x7fffffff8;
      if ((uVar3 & 0x7fffffff8) != 8) {
        uVar3 = uVar3 >> 3;
        uVar9 = 1;
        for (uVar8 = 0; uVar8 != (int)uVar3 - 1; uVar8 = uVar8 + 1) {
          left = *(Function **)(&(p_Var4[1]._M_parent)->_M_color + uVar8 * 2);
          sVar5 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                             local_60,(key_type *)left);
          replacements._M_t._M_impl.super__Rb_tree_header._M_node_count = uVar9;
          if (sVar5 == 0) {
            for (; uVar9 < (uVar3 & 0xffffffff); uVar9 = uVar9 + 1) {
              right = *(Function **)(&(p_Var4[1]._M_parent)->_M_color + uVar9 * 2);
              sVar5 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::
                      count((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                            local_60,(key_type *)right);
              if ((sVar5 == 0) && (bVar2 = FunctionUtils::equal(left,right), bVar2)) {
                pmVar6 = std::
                         map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                         ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                       *)local_c8,(key_type *)right);
                pcVar1 = (left->super_Importable).super_Named.name.super_IString.str._M_str;
                (pmVar6->super_IString).str._M_len =
                     (left->super_Importable).super_Named.name.super_IString.str._M_len;
                (pmVar6->super_IString).str._M_str = pcVar1;
                std::
                _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                ::_M_insert_unique<wasm::Name_const&>
                          ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                            *)local_60,(Name *)right);
              }
            }
          }
          uVar9 = replacements._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        }
      }
    }
    if (replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) break;
    hashes.
    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_60;
    pred = &hashes.
            super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_node_count;
    Module::removeFunctions(module,(function<bool_(wasm::Function_*)> *)pred);
    std::_Function_base::~_Function_base((_Function_base *)pred);
    OptUtils::replaceFunctions
              ((this->super_Pass).runner,module,
               (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                *)local_c8);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_60);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 *)local_c8);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                 *)local_248);
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                 *)local_118);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_60);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_c8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
               *)local_248);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
               *)local_118);
  return;
}

Assistant:

void run(Module* module) override {
    // Multiple iterations may be necessary: A and B may be identical only after
    // we see the functions C1 and C2 that they call are in fact identical.
    // Rarely, such "chains" can be very long, so we limit how many we do.
    auto& options = getPassOptions();
    Index limit;
    if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
      limit = module->functions.size(); // no limit
    } else if (options.optimizeLevel >= 2) {
      // 10 passes usually does most of the work, as this is typically
      // logarithmic
      limit = 10;
    } else {
      limit = 1;
    }
    while (limit > 0) {
      limit--;
      // Hash all the functions
      auto hashes = FunctionHasher::createMap(module);
      FunctionHasher(&hashes).run(getPassRunner(), module);
      // Find hash-equal groups
      std::map<uint32_t, std::vector<Function*>> hashGroups;
      ModuleUtils::iterDefinedFunctions(*module, [&](Function* func) {
        hashGroups[hashes[func]].push_back(func);
      });
      // Find actually equal functions and prepare to replace them
      std::map<Name, Name> replacements;
      std::set<Name> duplicates;
      for (auto& [_, group] : hashGroups) {
        Index size = group.size();
        if (size == 1) {
          continue;
        }
        // The groups should be fairly small, and even if a group is large we
        // should have almost all of them identical, so we should not hit actual
        // O(N^2) here unless the hash is quite poor.
        for (Index i = 0; i < size - 1; i++) {
          auto* first = group[i];
          if (duplicates.count(first->name)) {
            continue;
          }
          for (Index j = i + 1; j < size; j++) {
            auto* second = group[j];
            if (duplicates.count(second->name)) {
              continue;
            }
            if (FunctionUtils::equal(first, second)) {
              // great, we can replace the second with the first!
              replacements[second->name] = first->name;
              duplicates.insert(second->name);
            }
          }
        }
      }
      // perform replacements
      if (replacements.size() > 0) {
        // remove the duplicates
        module->removeFunctions(
          [&](Function* func) { return duplicates.count(func->name) > 0; });
        OptUtils::replaceFunctions(getPassRunner(), *module, replacements);
      } else {
        break;
      }
    }
  }